

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# environment.c
# Opt level: O2

char * apprun_env_envp_entry_create(char *name_prefix,char *name,char *value)

{
  size_t sVar1;
  char *pcVar2;
  int iVar3;
  
  if (name_prefix == (char *)0x0) {
    iVar3 = 0;
  }
  else {
    sVar1 = strlen(name_prefix);
    iVar3 = (int)sVar1;
  }
  if (name != (char *)0x0) {
    sVar1 = strlen(name);
    iVar3 = iVar3 + (int)sVar1;
  }
  if (value != (char *)0x0) {
    sVar1 = strlen(value);
    iVar3 = iVar3 + (int)sVar1;
  }
  pcVar2 = (char *)calloc((ulong)(iVar3 + 2),1);
  if (name_prefix != (char *)0x0) {
    strcat(pcVar2,name_prefix);
  }
  if (name != (char *)0x0) {
    strcat(pcVar2,name);
  }
  sVar1 = strlen(pcVar2);
  (pcVar2 + sVar1)[0] = '=';
  (pcVar2 + sVar1)[1] = '\0';
  if (value != (char *)0x0) {
    pcVar2 = strcat(pcVar2,value);
    return pcVar2;
  }
  return pcVar2;
}

Assistant:

char *apprun_env_envp_entry_create(char const *name_prefix, char const *name, char const *value) {
    unsigned size = 0;
    if (name_prefix != NULL)
        size += strlen(name_prefix);
    if (name != NULL)
        size += strlen(name);
    if (value != NULL)
        size += strlen(value);

    // allocate enough space for '=' and the NULL termination
    char *entry = calloc(size + 2, sizeof(char));
    if (name_prefix)
        strcat(entry, name_prefix);

    if (name)
        strcat(entry, name);

    strcat(entry, "=");

    if (value)
        strcat(entry, value);

    return entry;
}